

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O1

BOOL anon_unknown.dwarf_2114f::selector_types_equal(char *t1,char *t2)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (t2 == (char *)0x0 || t1 == (char *)0x0) {
    return t1 == t2;
  }
  do {
    if (*t1 == '\0') {
      return '\x01';
    }
    if (*t2 == '\0') {
      return '\x01';
    }
    pcVar2 = skip_irrelevant_type_info(t1);
    pcVar3 = skip_irrelevant_type_info(t2);
    cVar1 = *pcVar2;
    if ((cVar1 == '*') && (*pcVar3 != '*')) {
      if (*pcVar3 != '^') {
        return '\0';
      }
      if ((byte)(pcVar3[1] | 0x20U) != 99) {
        return '\0';
      }
      pcVar3 = pcVar3 + 1;
    }
    else if ((*pcVar3 == '*') && (cVar1 != '*')) {
      if ((cVar1 != '^') || ((byte)(pcVar2[1] | 0x20U) != 99)) {
        return '\0';
      }
      pcVar2 = pcVar2 + 1;
    }
    else if (cVar1 != *pcVar3) {
      return '\0';
    }
    t1 = pcVar2 + (*pcVar2 != '\0');
    t2 = pcVar3 + (*pcVar3 != '\0');
  } while( true );
}

Assistant:

static BOOL selector_types_equal(const char *t1, const char *t2)
{
	if (t1 == nullptr || t2 == nullptr) { return t1 == t2; }

	while (('\0' != *t1) && ('\0' != *t2))
	{
		t1 = skip_irrelevant_type_info(t1);
		t2 = skip_irrelevant_type_info(t2);
		// This is a really ugly hack.  For some stupid reason, the people
		// designing Objective-C type encodings decided to allow * as a
		// shorthand for char*, because strings are 'special'.  Unfortunately,
		// FSF GCC generates "*" for @encode(BOOL*), while Clang and Apple GCC
		// generate "^c" or "^C" (depending on whether BOOL is declared
		// unsigned).  
		//
		// The correct fix is to remove * completely from type encodings, but
		// unfortunately my time machine is broken so I can't travel to 1986
		// and apply a cluebat to those responsible.
		if ((*t1 == '*') && (*t2 != '*'))
		{
			if (*t2 == '^' && (((*(t2+1) == 'C') || (*(t2+1) == 'c'))))
			{
				t2++;
			}
			else
			{
				return NO;
			}
		}
		else if ((*t2 == '*') && (*t1 != '*'))
		{
			if (*t1 == '^' && (((*(t1+1) == 'C') || (*(t1+1) == 'c'))))
			{
				t1++;
			}
			else
			{
				return NO;
			}
		}
		else if (*t1 != *t2)
		{
			return NO;
		}

		if ('\0' != *t1) { t1++; }
		if ('\0' != *t2) { t2++; }
	}
	return YES;
}